

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O0

int testCommandLineArguments(void)

{
  pointer *this;
  int iVar1;
  char **ppcVar2;
  ostream *poVar3;
  undefined1 local_98 [8];
  CommandLineArguments args3;
  char *u8_arg;
  int i;
  char **u8_argv;
  undefined1 local_58 [8];
  CommandLineArguments arg2;
  CommandLineArguments args;
  char *argv [2];
  int local_c;
  int status;
  
  local_c = 0;
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)anon_var_dwarf_1bd07;
  this = &arg2.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  cmsys::Encoding::CommandLineArguments::CommandLineArguments
            ((CommandLineArguments *)this,2,
             (char **)&args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  cmsys::Encoding::CommandLineArguments::CommandLineArguments
            ((CommandLineArguments *)local_58,(CommandLineArguments *)this);
  ppcVar2 = cmsys::Encoding::CommandLineArguments::argv
                      ((CommandLineArguments *)
                       &arg2.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  u8_arg._4_4_ = 0;
  while( true ) {
    iVar1 = cmsys::Encoding::CommandLineArguments::argc
                      ((CommandLineArguments *)
                       &arg2.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (iVar1 <= u8_arg._4_4_) break;
    args3.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)ppcVar2[u8_arg._4_4_];
    iVar1 = strcmp(argv[(long)u8_arg._4_4_ + -1],
                   (char *)args3.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    if (iVar1 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"argv[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,u8_arg._4_4_);
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,argv[(long)u8_arg._4_4_ + -1]);
      poVar3 = std::operator<<(poVar3," != ");
      poVar3 = std::operator<<(poVar3,(char *)args3.argv_.
                                              super__Vector_base<char_*,_std::allocator<char_*>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_c = local_c + 1;
    }
    u8_arg._4_4_ = u8_arg._4_4_ + 1;
  }
  cmsys::Encoding::CommandLineArguments::Main
            ((CommandLineArguments *)local_98,2,
             (char **)&args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_98);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_58);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments
            ((CommandLineArguments *)
             &arg2.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return local_c;
}

Assistant:

static int testCommandLineArguments()
{
  int status = 0;

  char const* argv[2] = { "./app.exe", (char const*)helloWorldStrings[1] };

  kwsys::Encoding::CommandLineArguments args(2, argv);
  kwsys::Encoding::CommandLineArguments arg2 =
    kwsys::Encoding::CommandLineArguments(args);

  char const* const* u8_argv = args.argv();
  for (int i = 0; i < args.argc(); i++) {
    char const* u8_arg = u8_argv[i];
    if (strcmp(argv[i], u8_arg) != 0) {
      std::cout << "argv[" << i << "] " << argv[i] << " != " << u8_arg
                << std::endl;
      status++;
    }
  }

  kwsys::Encoding::CommandLineArguments args3 =
    kwsys::Encoding::CommandLineArguments::Main(2, argv);

  return status;
}